

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

void __thiscall
std::
_Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<TestCountExpr>_>
::_Tuple_impl(_Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<TestCountExpr>_>
              *this)

{
  (this->
  super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<TestCountExpr>_>).
  super__Tuple_impl<2UL,_testing::Matcher<TestCountExpr>_>.
  super__Head_base<2UL,_testing::Matcher<TestCountExpr>,_false>._M_head_impl.
  super_MatcherBase<TestCountExpr>.impl_.value_ = (MatcherInterface<TestCountExpr> *)0x0;
  (this->
  super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<TestCountExpr>_>).
  super__Tuple_impl<2UL,_testing::Matcher<TestCountExpr>_>.
  super__Head_base<2UL,_testing::Matcher<TestCountExpr>,_false>._M_head_impl.
  super_MatcherBase<TestCountExpr>.impl_.link_.next_ =
       &(this->
        super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<TestCountExpr>_>
        ).super__Tuple_impl<2UL,_testing::Matcher<TestCountExpr>_>.
        super__Head_base<2UL,_testing::Matcher<TestCountExpr>,_false>._M_head_impl.
        super_MatcherBase<TestCountExpr>.impl_.link_;
  (this->
  super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<TestCountExpr>_>).
  super__Tuple_impl<2UL,_testing::Matcher<TestCountExpr>_>.
  super__Head_base<2UL,_testing::Matcher<TestCountExpr>,_false>._M_head_impl.
  super_MatcherBase<TestCountExpr>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_002b2ed8;
  (this->
  super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<TestCountExpr>_>).
  super__Head_base<1UL,_testing::Matcher<BasicTestExpr<1>_>,_false>._M_head_impl.
  super_MatcherBase<BasicTestExpr<1>_>.impl_.value_ = (MatcherInterface<BasicTestExpr<1>_> *)0x0;
  (this->
  super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<TestCountExpr>_>).
  super__Head_base<1UL,_testing::Matcher<BasicTestExpr<1>_>,_false>._M_head_impl.
  super_MatcherBase<BasicTestExpr<1>_>.impl_.link_.next_ =
       &(this->
        super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<TestCountExpr>_>
        ).super__Head_base<1UL,_testing::Matcher<BasicTestExpr<1>_>,_false>._M_head_impl.
        super_MatcherBase<BasicTestExpr<1>_>.impl_.link_;
  (this->
  super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<TestCountExpr>_>).
  super__Head_base<1UL,_testing::Matcher<BasicTestExpr<1>_>,_false>._M_head_impl.
  super_MatcherBase<BasicTestExpr<1>_>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_002b2b30;
  (this->super__Head_base<0UL,_testing::Matcher<mp::expr::Kind>,_false>)._M_head_impl.
  super_MatcherBase<mp::expr::Kind>.impl_.value_ = (MatcherInterface<mp::expr::Kind> *)0x0;
  (this->super__Head_base<0UL,_testing::Matcher<mp::expr::Kind>,_false>)._M_head_impl.
  super_MatcherBase<mp::expr::Kind>.impl_.link_.next_ =
       &(this->super__Head_base<0UL,_testing::Matcher<mp::expr::Kind>,_false>)._M_head_impl.
        super_MatcherBase<mp::expr::Kind>.impl_.link_;
  (this->super__Head_base<0UL,_testing::Matcher<mp::expr::Kind>,_false>)._M_head_impl.
  super_MatcherBase<mp::expr::Kind>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_002b2b98;
  return;
}

Assistant:

void capture(T* ptr) {
    value_ = ptr;
    link_.join_new();
  }